

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::identStmt(Parser *this)

{
  Report *pRVar1;
  bool bVar2;
  Token TVar3;
  Type TVar4;
  SourceLocation *pSVar5;
  SymbolTable *pSVar6;
  Expr *pEVar7;
  pointer pEVar8;
  FilePos *endPos;
  Parser *in_RSI;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> local_1b8;
  ParamList local_1b0;
  VariableSym *local_178;
  undefined1 local_170 [24];
  undefined1 local_158 [8];
  unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> call;
  allocator<char> local_141;
  string local_140;
  LiteralType local_120;
  LiteralType local_11c;
  LiteralType rightType;
  LiteralType leftType;
  VariableSym *var;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> value;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_a8;
  Symbol *callee;
  list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> symbols;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> stmt;
  undefined1 local_70 [8];
  string name;
  SourceLocation loc;
  Parser *this_local;
  
  pSVar5 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)((long)&name.field_2 + 8),pSVar5);
  stringValue_abi_cxx11_((string *)local_70,in_RSI);
  nextToken(in_RSI);
  std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
  unique_ptr<std::default_delete<flow::lang::Stmt>,void>
            ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)
             &symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>::list
            ((list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)&callee);
  pSVar6 = currentScope(in_RSI);
  local_a8._M_head_impl =
       (Expr *)SymbolTable::lookup(pSVar6,(string *)local_70,All,
                                   (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>
                                    *)&callee);
  if ((VariableSym *)local_a8._M_head_impl == (VariableSym *)0x0) {
    TVar3 = token(in_RSI);
    if (TVar3 != Semicolon) {
      pRVar1 = in_RSI->report_;
      pSVar5 = lastLocation(in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Unknown symbol \'{}\'.",&local_c9);
      std::__cxx11::string::string((string *)&local_f0,(string *)local_70);
      diagnostics::Report::typeError<std::__cxx11::string>(pRVar1,pSVar5,&local_c8,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
      goto LAB_00151934;
    }
    pSVar6 = globalScope(in_RSI);
    std::make_unique<flow::lang::HandlerSym,std::__cxx11::string&,flow::SourceLocation&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
               (SourceLocation *)local_70);
    std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
    unique_ptr<flow::lang::HandlerSym,std::default_delete<flow::lang::HandlerSym>,void>
              ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)local_100,
               (unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
               &value);
    local_a8._M_head_impl = (Expr *)SymbolTable::appendSymbol(pSVar6,local_100);
    std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>::~unique_ptr
              (local_100);
    std::unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_>::
    ~unique_ptr((unique_ptr<flow::lang::HandlerSym,_std::default_delete<flow::lang::HandlerSym>_> *)
                &value);
    std::__cxx11::list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>::push_back
              ((list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)&callee,
               (value_type *)&local_a8);
  }
  TVar4 = Symbol::type((Symbol *)local_a8._M_head_impl);
  if (TVar4 == Variable) {
    bVar2 = consume(in_RSI,Assign);
    if (!bVar2) {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
      goto LAB_00151934;
    }
    expr((Parser *)&var);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&var);
    if (bVar2) {
      _rightType = local_a8._M_head_impl;
      pEVar7 = VariableSym::initializer((VariableSym *)local_a8._M_head_impl);
      local_11c = (*(pEVar7->super_ASTNode)._vptr_ASTNode[3])();
      pEVar8 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                         ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                          &var);
      local_120 = (*(pEVar8->super_ASTNode)._vptr_ASTNode[3])();
      if (local_11c == local_120) {
        endPos = end(in_RSI);
        SourceLocation::update((SourceLocation *)((long)&name.field_2 + 8),endPos);
        std::
        make_unique<flow::lang::AssignStmt,flow::lang::VariableSym*&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                  ((VariableSym **)&call,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                   &rightType,(SourceLocation *)&var);
        std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::operator=
                  ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)
                   &symbols.
                    super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
                    _M_impl._M_node._M_size,
                   (unique_ptr<flow::lang::AssignStmt,_std::default_delete<flow::lang::AssignStmt>_>
                    *)&call);
        std::unique_ptr<flow::lang::AssignStmt,_std::default_delete<flow::lang::AssignStmt>_>::
        ~unique_ptr((unique_ptr<flow::lang::AssignStmt,_std::default_delete<flow::lang::AssignStmt>_>
                     *)&call);
        local_100[1]._M_t.
        super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
        super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 2;
      }
      else {
        pRVar1 = in_RSI->report_;
        pSVar5 = lastLocation(in_RSI);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"Type mismatch in assignment. Expected <{}> but got <{}>.",
                   &local_141);
        diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                  (pRVar1,pSVar5,&local_140,local_11c,local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator(&local_141);
        std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
        unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                  ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                   (nullptr_t)0x0);
        local_100[1]._M_t.
        super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
        super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
      }
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
    }
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&var);
joined_r0x001516a9:
    if (local_100[1]._M_t.
        super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
        super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ != 2)
    goto LAB_00151934;
  }
  else if (TVar4 == Handler) {
    local_178 = (VariableSym *)local_a8._M_head_impl;
    ParamList::ParamList(&local_1b0);
    std::
    make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*,flow::lang::ParamList>
              ((SourceLocation *)local_170,(CallableSym **)((long)&name.field_2 + 8),
               (ParamList *)&local_178);
    std::
    make_unique<flow::lang::ExprStmt,std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>>
              ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
               (local_170 + 8));
    std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::operator=
              ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)
               &symbols.
                super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
                _M_impl._M_node._M_size,
               (unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_> *)
               (local_170 + 8));
    std::unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_>::~unique_ptr
              ((unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_> *)
               (local_170 + 8));
    std::unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_>::~unique_ptr
              ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
               local_170);
    ParamList::~ParamList(&local_1b0);
  }
  else if (TVar4 - BuiltinFunction < 2) {
    callStmt((Parser *)local_158,
             (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)in_RSI);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_158);
    if (bVar2) {
      std::
      make_unique<flow::lang::ExprStmt,std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>>
                ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
                 (local_170 + 0x10));
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::operator=
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)
                 &symbols.
                  super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
                  _M_impl._M_node._M_size,
                 (unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_> *)
                 (local_170 + 0x10));
      std::unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_>::~unique_ptr
                ((unique_ptr<flow::lang::ExprStmt,_std::default_delete<flow::lang::ExprStmt>_> *)
                 (local_170 + 0x10));
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 2;
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
    }
    std::unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_>::~unique_ptr
              ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
               local_158);
    goto joined_r0x001516a9;
  }
  bVar2 = testTokens<flow::lang::Token,flow::lang::Token>(in_RSI,If,Unless);
  if (bVar2) {
    std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::unique_ptr
              (&local_1b8,
               (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
               &symbols.
                super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
                _M_impl._M_node._M_size);
    postscriptStmt(this,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                        in_RSI);
    std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
              (&local_1b8);
    local_100[1]._M_t.
    super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
    super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    bVar2 = consume(in_RSI,Semicolon);
    if (bVar2) {
      std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::unique_ptr
                ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)this,
                 (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                 &symbols.
                  super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
                  _M_impl._M_node._M_size);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      local_100[1]._M_t.
      super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl._4_4_ = 1;
    }
  }
LAB_00151934:
  std::__cxx11::list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>::~list
            ((list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)&callee);
  std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
            ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
             &symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::string::~string((string *)local_70);
  SourceLocation::~SourceLocation((SourceLocation *)((long)&name.field_2 + 8));
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::identStmt() {
  // identStmt  ::= callStmt | assignStmt
  // callStmt   ::= NAME ['(' paramList ')' | paramList] (';' | LF)
  // assignStmt ::= NAME '=' expr [';' | LF]
  //
  // NAME may be a builtin-function, builtin-handler, handler-name, or variable.

  SourceLocation loc(location());
  std::string name = stringValue();
  nextToken();  // IDENT

  std::unique_ptr<Stmt> stmt;
  std::list<Symbol*> symbols;
  Symbol* callee = currentScope()->lookup(name, Lookup::All, &symbols);
  if (!callee) {
    // XXX assume that given symbol is a auto forward-declared handler that's
    // being defined later in the source.
    if (token() != Token::Semicolon) {
      report_.typeError(lastLocation(), "Unknown symbol '{}'.", name);
      return nullptr;
    }

    callee = (HandlerSym*)globalScope()->appendSymbol(
        std::make_unique<HandlerSym>(name, loc));
    symbols.push_back(callee);
  }

  switch (callee->type()) {
    case Symbol::Variable: {  // var '=' expr (';' | LF)
      if (!consume(Token::Assign)) return nullptr;

      std::unique_ptr<Expr> value = expr();
      if (!value) return nullptr;

      VariableSym* var = static_cast<VariableSym*>(callee);
      LiteralType leftType = var->initializer()->getType();
      LiteralType rightType = value->getType();
      if (leftType != rightType) {
        report_.typeError(
            lastLocation(),
            "Type mismatch in assignment. Expected <{}> but got <{}>.",
            leftType, rightType);
        return nullptr;
      }

      stmt = std::make_unique<AssignStmt>(var, std::move(value),
                                          loc.update(end()));
      break;
    }
    case Symbol::BuiltinFunction:
    case Symbol::BuiltinHandler: {
      auto call = callStmt(symbols);
      if (!call) {
        return nullptr;
      }
      stmt = std::make_unique<ExprStmt>(std::move(call));
      break;
    }
    case Symbol::Handler:
      stmt = std::make_unique<ExprStmt>(
          std::make_unique<CallExpr>(loc, (CallableSym*)callee, ParamList()));
      break;
    default:
      break;
  }

  // postscript statement handling
  if (testTokens(Token::If, Token::Unless))
      return postscriptStmt(std::move(stmt));

  if (!consume(Token::Semicolon))
    return nullptr;

  return stmt;
}